

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_deleteCols(HModel *this,int firstcol,int lastcol)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n");
  std::ostream::flush();
  lVar10 = (long)(lastcol - firstcol) + 1;
  iVar1 = this->numCol;
  iVar9 = (int)lVar10;
  lVar11 = (long)firstcol;
  lVar13 = (long)iVar9;
  if (firstcol < iVar1 - iVar9) {
    pdVar3 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = lVar11 + lVar13;
    lVar12 = 0;
    do {
      pdVar3[lVar11 + lVar12] = pdVar3[lVar14 + lVar12];
      pdVar4[lVar11 + lVar12] = pdVar4[lVar14 + lVar12];
      pdVar5[lVar11 + lVar12] = pdVar5[lVar14 + lVar12];
      pdVar6[lVar11 + lVar12] = pdVar6[lVar14 + lVar12];
      lVar12 = lVar12 + 1;
    } while ((iVar1 - lVar11) - lVar13 != lVar12);
  }
  piVar7 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar7[lVar11];
  lVar12 = (long)iVar1;
  iVar2 = piVar7[(long)lastcol + 1];
  lVar14 = (long)iVar2;
  if (iVar2 < piVar7[this->numCol]) {
    piVar8 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar8[lVar12] = piVar8[lVar14];
      pdVar3[lVar12] = pdVar3[lVar14];
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar14 < piVar7[this->numCol]);
  }
  uVar15 = this->numCol - iVar9;
  uVar16 = (ulong)uVar15;
  if (firstcol <= (int)uVar15) {
    lVar11 = lVar11 + -1;
    do {
      piVar7[lVar11 + 1] = piVar7[lVar13 + lVar11 + 1] - (iVar2 - iVar1);
      uVar16 = this->numCol - lVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)uVar16);
  }
  this->numCol = (int)uVar16;
  this->numTot = this->numTot - iVar9;
  this->mlFg_haveMatrixColWise = 0;
  this->mlFg_haveMatrixRowWise = 0;
  return;
}

Assistant:

void HModel::util_deleteCols(int firstcol, int lastcol) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  int colStep = lastcol-firstcol+1;
  for (int col = firstcol; col < numCol-colStep; col++) {
    //    printf("Copy from colCost[%d] to colCost[%d]\n", col+colStep, col);cout << flush;
    colCost[col] = colCost[col+colStep];
    colLower[col] = colLower[col+colStep];
    colUpper[col] = colUpper[col+colStep];
    colScale[col] = colScale[col+colStep];
  }
  int elOs = Astart[firstcol];
  int elStep = Astart[lastcol+1]-elOs;
  //    printf("El loop over cols %2d [%2d] to %2d [%2d]\n", lastcol+1, Astart[lastcol+1], numCol+1, Astart[numCol]-1);
  for (int el = Astart[lastcol+1]; el < Astart[numCol]; el++) {
    //        printf("Over-write entry %3d [%3d] by entry %3d [%3d]\n", el-elStep, Aindex[el-elStep], el, Aindex[el]);
    Aindex[el-elStep] = Aindex[el];
    Avalue[el-elStep] = Avalue[el];
  }
    
  for (int col = firstcol; col <= numCol-colStep; col++) {
    //    printf("Over-write start %3d [%3d] by entry %3d [%3d]\n", col, Astart[col], col+colStep,  Astart[col+colStep]-elStep);
    Astart[col] = Astart[col+colStep]-elStep;}
  
  //Reduce the number of columns and total number of variables in the model
  numCol -= colStep;
  numTot -= colStep;

  //ToDo Determine consequences for basis when deleting columns
  //Invalidate matrix copies
  mlFg_haveMatrixColWise = 0;
  mlFg_haveMatrixRowWise = 0;
}